

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

short duckdb::DeltaDecode<short>(short *data,short previous_value,size_t size)

{
  short sVar1;
  ulong uVar2;
  short sVar3;
  
  sVar3 = previous_value + *data;
  *data = sVar3;
  uVar2 = 1;
  if ((3 < size) && ((size & 0xfffffffffffffffc) != 4)) {
    do {
      sVar1 = data[uVar2];
      data[uVar2] = sVar3 + sVar1;
      sVar3 = sVar3 + sVar1 + data[uVar2 + 1];
      data[uVar2 + 1] = sVar3;
      sVar3 = sVar3 + data[uVar2 + 2];
      data[uVar2 + 2] = sVar3;
      sVar3 = sVar3 + data[uVar2 + 3];
      data[uVar2 + 3] = sVar3;
      uVar2 = uVar2 + 4;
    } while (uVar2 < (size & 0xfffffffffffffffc) - 4);
  }
  if (uVar2 != size) {
    sVar3 = data[uVar2 - 1];
    do {
      sVar3 = sVar3 + data[uVar2];
      data[uVar2] = sVar3;
      uVar2 = uVar2 + 1;
    } while (size != uVar2);
  }
  return (short)uVar2;
}

Assistant:

static T DeltaDecode(T *data, T previous_value, const size_t size) {
	D_ASSERT(size >= 1);

	data[0] += previous_value;

	const size_t UnrollQty = 4;
	const size_t sz0 = (size / UnrollQty) * UnrollQty; // equal to 0, if size < UnrollQty
	size_t i = 1;
	if (sz0 >= UnrollQty) {
		T a = data[0];
		for (; i < sz0 - UnrollQty; i += UnrollQty) {
			a = data[i] += a;
			a = data[i + 1] += a;
			a = data[i + 2] += a;
			a = data[i + 3] += a;
		}
	}
	for (; i != size; ++i) {
		data[i] += data[i - 1];
	}

	return data[size - 1];
}